

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetGridAxisDescriptors
          (Gridded_Data_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
          *GADS)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  int iVar3;
  pointer pKVar4;
  
  pKVar2 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vpGridAxisDesc).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    iVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[7])();
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - (short)iVar3;
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::operator=(&this->m_vpGridAxisDesc,GADS);
  pKVar4 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui8NumAxis = (KUINT8)(((long)pKVar2 - (long)pKVar4) / 0x18);
  for (; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    iVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[7])();
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (short)iVar3;
  }
  return;
}

Assistant:

void Gridded_Data_PDU::SetGridAxisDescriptors( const std::vector<GridAxisDescriptor> & GADS )
{
    // calculate length that needs to be removed.
    vector<GridAxisDescriptor>::const_iterator citr = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrEnd = m_vpGridAxisDesc.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= ( *citr )->GetLength();
    }

    m_vpGridAxisDesc = GADS;
    m_ui8NumAxis = m_vpGridAxisDesc.size();

    // Calculate the new PDU length.
    citr = m_vpGridAxisDesc.begin();
    citrEnd = m_vpGridAxisDesc.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetLength();
    }
}